

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall google::protobuf::Symbol::IsNestedDefinition(Symbol *this)

{
  Type TVar1;
  EnumDescriptor *this_00;
  Descriptor *pDVar2;
  FieldDescriptor *this_01;
  Symbol *this_local;
  
  TVar1 = type(this);
  if (TVar1 == MESSAGE) {
    pDVar2 = descriptor(this);
    pDVar2 = Descriptor::containing_type(pDVar2);
    this_local._7_1_ = pDVar2 != (Descriptor *)0x0;
  }
  else if (TVar1 == FIELD) {
    this_01 = field_descriptor(this);
    pDVar2 = FieldDescriptor::containing_type(this_01);
    this_local._7_1_ = pDVar2 != (Descriptor *)0x0;
  }
  else if (TVar1 == ENUM) {
    this_00 = enum_descriptor(this);
    pDVar2 = EnumDescriptor::containing_type(this_00);
    this_local._7_1_ = pDVar2 != (Descriptor *)0x0;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool IsNestedDefinition() const {
    switch (type()) {
      case MESSAGE:
        return descriptor()->containing_type() != nullptr;
      case ENUM:
        return enum_descriptor()->containing_type() != nullptr;
      case FIELD:  // For extension fields
        return field_descriptor()->containing_type() != nullptr;
      default:
        return false;
    }
  }